

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O3

void test_convert<long,double>(uint length,long value)

{
  bool bVar1;
  undefined1 (*pauVar2) [16];
  undefined8 *puVar3;
  undefined1 (*pauVar4) [16];
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  double dVar11;
  shared_ptr<long> pt;
  shared_ptr<double> pu;
  
  uVar8 = (ulong)length;
  uVar5 = 0xffffffffffffffff;
  if (-1 < (int)length) {
    uVar5 = uVar8 * 8;
  }
  pauVar2 = (undefined1 (*) [16])operator_new__(uVar5);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<long*,void(*)(long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt,pauVar2,nosimd::common::free<long>);
  pt.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar5);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<double*,void(*)(double*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu,
             pt.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<double>);
  auVar10._8_4_ = (int)value;
  auVar10._0_8_ = value;
  auVar10._12_4_ = (int)((ulong)value >> 0x20);
  uVar6 = (int)length >> 1;
  pauVar4 = pauVar2;
  uVar7 = uVar6;
  if (3 < (int)uVar6) {
    do {
      *pauVar4 = auVar10;
      pauVar4[1] = auVar10;
      pauVar4[2] = auVar10;
      pauVar4[3] = auVar10;
      uVar6 = uVar7 - 4;
      pauVar4 = pauVar4 + 4;
      bVar1 = 7 < uVar7;
      uVar7 = uVar6;
    } while (bVar1);
  }
  if (1 < (int)uVar6) {
    *pauVar4 = auVar10;
    pauVar4[1] = auVar10;
    uVar6 = uVar6 - 2;
    pauVar4 = pauVar4 + 2;
  }
  if (uVar6 != 0) {
    *pauVar4 = auVar10;
  }
  if (length != 0) {
    *(long *)(pauVar2[-1] + (long)(int)length * 8 + 8) = value;
    if (0 < (int)length) {
      uVar5 = 0;
      do {
        (&(pt.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar5] =
             (_func_int **)(double)*(long *)((long)*pauVar2 + uVar5 * 8);
        uVar5 = uVar5 + 1;
      } while (uVar8 != uVar5);
      if (length == 0) goto LAB_001057c2;
    }
    uVar5 = 0;
    do {
      dVar11 = (double)(&(pt.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                         ->_vptr__Sp_counted_base)[uVar5] - (double)value;
      uVar9 = -(ulong)(dVar11 < 0.0);
      if (2.220446049250313e-16 <=
          (double)(~uVar9 & (ulong)dVar11 |
                  (ulong)((double)value -
                         (double)(&(pt.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar5]) & uVar9)) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar3 = "void test_convert(unsigned int, _T) [_T = long, _U = double]";
        *(undefined4 *)(puVar3 + 1) = 0x17;
        *(uint *)((long)puVar3 + 0xc) = length;
        __cxa_throw(puVar3,&Exception::typeinfo,0);
      }
      uVar5 = uVar5 + 1;
    } while (uVar8 != uVar5);
  }
LAB_001057c2:
  if (pu.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pu.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pt.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pt.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}